

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_char(Context *context,IntrinsicResult partialResult)

{
  int32_t iVar1;
  size_t bytes;
  Value local_50;
  String s;
  char buf [5];
  String local_28;
  
  String::String(&local_28,"codePoint");
  Context::GetVar((Context *)&s,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  iVar1 = Value::IntValue((Value *)&s);
  Value::~Value((Value *)&s);
  String::~String(&local_28);
  bytes = UTF8Encode((long)iVar1,(uchar *)buf);
  String::String(&s,buf,bytes);
  local_50.type = String;
  local_50.noInvoke = false;
  local_50.localOnly = Off;
  if (s.ss == (StringStorage *)0x0) {
    s.ss = (StringStorage *)Value::emptyString._8_8_;
  }
  if (s.ss != (StringStorage *)0x0) {
    ((s.ss)->super_RefCountedStorage).refCount = ((s.ss)->super_RefCountedStorage).refCount + 1;
  }
  local_50.data = (anon_union_8_3_2f476f46_for_data)s.ss;
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_50,true);
  Value::~Value(&local_50);
  String::~String(&s);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_char(Context *context, IntrinsicResult partialResult) {
		long codePoint = context->GetVar("codePoint").IntValue();
		char buf[5];
		long len = UTF8Encode((unsigned long)codePoint, (unsigned char*)buf);
		String s(buf, (size_t)len);
		return IntrinsicResult(s);
	}